

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O2

void __thiscall TreeWalker::acceptConnections(TreeWalker *this,DomConnections *connections)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<DomConnection_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  while( true ) {
    local_48.d = (connections->m_connection).d.d;
    local_48.ptr = (connections->m_connection).d.ptr;
    uVar1 = (connections->m_connection).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48.size = uVar1;
    QArrayDataPointer<DomConnection_*>::~QArrayDataPointer(&local_48);
    if (uVar1 <= uVar2) break;
    local_48.d = (connections->m_connection).d.d;
    local_48.ptr = (connections->m_connection).d.ptr;
    local_48.size = (connections->m_connection).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (*this->_vptr_TreeWalker[0x1e])(this,local_48.ptr[uVar2]);
    QArrayDataPointer<DomConnection_*>::~QArrayDataPointer(&local_48);
    uVar2 = uVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TreeWalker::acceptConnections(DomConnections *connections)
{
    for (int i=0; i<connections->elementConnection().size(); ++i)
        acceptConnection(connections->elementConnection().at(i));
}